

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O0

void rpc_tests::CheckRpc(vector<RPCArg,_std::allocator<RPCArg>_> *params,UniValue *args,
                        RPCMethodImpl *test_impl)

{
  long lVar1;
  RPCResult *in_RDX;
  undefined8 in_RSI;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_RDI;
  long in_FS_OFFSET;
  JSONRPCRequest req;
  RPCHelpMan rpc;
  RPCResult null_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac8;
  JSONRPCRequest *this;
  UniValue *in_stack_fffffffffffffad0;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffffad8;
  UniValue *this_00;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *__x;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *this_01;
  JSONRPCRequest *this_02;
  RPCResult *this_03;
  char *in_stack_fffffffffffffb10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb18;
  RPCResult *this_04;
  undefined1 skip_type_check;
  undefined8 in_stack_fffffffffffffb38;
  undefined8 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  undefined8 in_stack_fffffffffffffb50;
  undefined1 local_4a1 [55];
  undefined1 local_46a;
  undefined1 local_469 [39];
  allocator<char> local_442;
  allocator<char> local_441 [17];
  undefined8 in_stack_fffffffffffffbd0;
  undefined8 in_stack_fffffffffffffbd8;
  RPCExamples *in_stack_fffffffffffffc10;
  undefined8 in_stack_fffffffffffffc18;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_fffffffffffffc20;
  undefined8 in_stack_fffffffffffffc28;
  undefined8 in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  RPCMethodImpl *in_stack_fffffffffffffd30;
  
  skip_type_check = (undefined1)((ulong)in_RSI >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_03 = (RPCResult *)local_441;
  this_04 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,(allocator<char> *)this_03);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,(allocator<char> *)this_03);
  local_469._1_8_ = 0;
  local_469._9_8_ = 0;
  local_469._17_8_ = 0;
  this_02 = (JSONRPCRequest *)(local_469 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffac8);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
             (string *)in_stack_fffffffffffffb40,(string *)in_stack_fffffffffffffb38,in_RDI,
             (bool)skip_type_check);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(in_stack_fffffffffffffad8);
  std::__cxx11::string::~string(in_stack_fffffffffffffac8);
  std::allocator<char>::~allocator(&local_442);
  std::__cxx11::string::~string(in_stack_fffffffffffffac8);
  std::allocator<char>::~allocator(local_441);
  this_01 = (function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)local_469;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,(allocator<char> *)this_03);
  __x = (function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)&local_46a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,(allocator<char> *)this_03);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)this_04,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffb18);
  RPCResult::RPCResult(this_03,in_RDX);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
             (RPCResult *)in_stack_fffffffffffffb40);
  this_00 = (UniValue *)local_4a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,(allocator<char> *)this_03);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffffac8,(string *)0x9b7b4a);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::function(this_01,__x);
  this = (JSONRPCRequest *)&stack0xfffffffffffffb38;
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)in_stack_fffffffffffffc38,(string *)in_stack_fffffffffffffc30,
             (string *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
             (RPCResults *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
             in_stack_fffffffffffffd30);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_4a1);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_46a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_469);
  JSONRPCRequest::JSONRPCRequest(this_02);
  UniValue::operator=(this_00,in_stack_fffffffffffffad0);
  RPCHelpMan::HandleRequest
            ((RPCHelpMan *)in_stack_fffffffffffffbd8,(JSONRPCRequest *)in_stack_fffffffffffffbd0);
  UniValue::~UniValue((UniValue *)this);
  JSONRPCRequest::~JSONRPCRequest(this);
  RPCHelpMan::~RPCHelpMan((RPCHelpMan *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CheckRpc(const std::vector<RPCArg>& params, const UniValue& args, RPCHelpMan::RPCMethodImpl test_impl)
{
    auto null_result{RPCResult{RPCResult::Type::NONE, "", "None"}};
    const RPCHelpMan rpc{"dummy", "dummy description", params, null_result, RPCExamples{""}, test_impl};
    JSONRPCRequest req;
    req.params = args;

    rpc.HandleRequest(req);
}